

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

int MakeCapLoopHelper(ON_ClassArray<ON_Extrusion_BrepForm_FaceInfo> *finfo,int fi0,int cap_index,
                     ON_BrepFace *capface,TYPE loop_type,bool *bTrimsWereModified)

{
  ON_BrepLoop *pOVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ON_Extrusion_BrepForm_FaceInfo *pOVar5;
  int *piVar6;
  ON_SimpleArray<int> *this;
  ON_3dPoint local_b8;
  ON_3dPoint local_a0;
  ON_BrepTrim *local_88;
  ON_BrepTrim *trim1;
  ON_BrepTrim *trim0;
  ON_BrepTrim *pOStack_70;
  int lti;
  ON_BrepTrim *trim;
  ON_NurbsCurve *pOStack_60;
  int c2i;
  ON_NurbsCurve *c2;
  int fi1;
  bool bCloseGaps;
  bool bRev3d;
  ON_BrepLoop *loop;
  ON_Brep *brep;
  ON_BrepEdge *edge;
  bool *bTrimsWereModified_local;
  ON_BrepFace *pOStack_28;
  TYPE loop_type_local;
  ON_BrepFace *capface_local;
  int cap_index_local;
  int fi0_local;
  ON_ClassArray<ON_Extrusion_BrepForm_FaceInfo> *finfo_local;
  
  finfo_local._4_4_ = fi0;
  if (capface != (ON_BrepFace *)0x0) {
    edge = (ON_BrepEdge *)bTrimsWereModified;
    bTrimsWereModified_local._4_4_ = loop_type;
    pOStack_28 = capface;
    capface_local._0_4_ = cap_index;
    capface_local._4_4_ = fi0;
    _cap_index_local = finfo;
    loop = (ON_BrepLoop *)ON_BrepFace::Brep(capface);
    iVar4 = capface_local._4_4_;
    if ((ON_Brep *)loop == (ON_Brep *)0x0) {
      finfo_local._4_4_ = capface_local._4_4_;
    }
    else if ((capface_local._4_4_ < 0) ||
            (iVar3 = ON_ClassArray<ON_Extrusion_BrepForm_FaceInfo>::Count(_cap_index_local),
            iVar3 <= iVar4)) {
      finfo_local._4_4_ = capface_local._4_4_;
    }
    else {
      _fi1 = ON_Brep::NewLoop((ON_Brep *)loop,bTrimsWereModified_local._4_4_,pOStack_28);
      c2._7_1_ = 0;
      c2._6_1_ = 1;
      for (c2._0_4_ = capface_local._4_4_; iVar4 = (int)c2,
          iVar3 = ON_ClassArray<ON_Extrusion_BrepForm_FaceInfo>::Count(_cap_index_local),
          iVar4 < iVar3; c2._0_4_ = (int)c2 + 1) {
        pOVar5 = ON_ClassArray<ON_Extrusion_BrepForm_FaceInfo>::operator[](_cap_index_local,(int)c2)
        ;
        bVar2 = ON_Extrusion_BrepForm_FaceInfo::HaveBrepFaceFace(pOVar5);
        if (bVar2) {
          pOVar5 = ON_ClassArray<ON_Extrusion_BrepForm_FaceInfo>::operator[]
                             (_cap_index_local,capface_local._4_4_);
          iVar4 = pOVar5->m_profile_index;
          pOVar5 = ON_ClassArray<ON_Extrusion_BrepForm_FaceInfo>::operator[]
                             (_cap_index_local,(int)c2);
          if (iVar4 != pOVar5->m_profile_index) break;
          pOVar5 = ON_ClassArray<ON_Extrusion_BrepForm_FaceInfo>::operator[]
                             (_cap_index_local,(int)c2);
          pOStack_60 = pOVar5->m_cap_c2[(int)capface_local];
          if (pOStack_60 == (ON_NurbsCurve *)0x0) {
            c2._6_1_ = 0;
            break;
          }
          trim._4_4_ = ON_Brep::AddTrimCurve((ON_Brep *)loop,&pOStack_60->super_ON_Curve);
          pOVar5 = ON_ClassArray<ON_Extrusion_BrepForm_FaceInfo>::operator[]
                             (_cap_index_local,(int)c2);
          pOVar1 = loop;
          pOVar5->m_cap_c2[(int)capface_local] = (ON_NurbsCurve *)0x0;
          pOVar5 = ON_ClassArray<ON_Extrusion_BrepForm_FaceInfo>::operator[]
                             (_cap_index_local,(int)c2);
          brep = (ON_Brep *)
                 ON_Brep::Edge((ON_Brep *)pOVar1,pOVar5->m_cap_edge_index[(int)capface_local]);
          if (brep == (ON_Brep *)0x0) {
            c2._6_1_ = 0;
            break;
          }
          pOStack_70 = ON_Brep::NewTrim((ON_Brep *)loop,(ON_BrepEdge *)brep,(bool)(c2._7_1_ & 1),
                                        _fi1,trim._4_4_);
          pOStack_70->m_tolerance[1] = 0.0;
          pOStack_70->m_tolerance[0] = 0.0;
        }
      }
      ON_Brep::SetTrimIsoFlags((ON_Brep *)loop,_fi1);
      if ((c2._6_1_ & 1) != 0) {
        for (trim0._4_4_ = 0; iVar4 = trim0._4_4_, iVar3 = ON_SimpleArray<int>::Count(&_fi1->m_ti),
            iVar4 < iVar3; trim0._4_4_ = trim0._4_4_ + 1) {
          pOVar1 = loop + 1;
          piVar6 = ON_SimpleArray<int>::operator[](&_fi1->m_ti,trim0._4_4_);
          trim1 = ON_ClassArray<ON_BrepTrim>::operator[]
                            ((ON_ClassArray<ON_BrepTrim> *)&pOVar1->m_status,*piVar6);
          pOVar1 = loop + 1;
          this = &_fi1->m_ti;
          iVar4 = trim0._4_4_ + 1;
          iVar3 = ON_SimpleArray<int>::Count(&_fi1->m_ti);
          piVar6 = ON_SimpleArray<int>::operator[](this,iVar4 % iVar3);
          local_88 = ON_ClassArray<ON_BrepTrim>::operator[]
                               ((ON_ClassArray<ON_BrepTrim> *)&pOVar1->m_status,*piVar6);
          ON_Curve::PointAtEnd(&local_a0,(ON_Curve *)trim1);
          ON_Curve::PointAtStart(&local_b8,(ON_Curve *)local_88);
          bVar2 = ON_3dPoint::operator!=(&local_a0,&local_b8);
          if ((bVar2) && (bVar2 = ON_Brep::CloseTrimGap((ON_Brep *)loop,trim1,local_88), bVar2)) {
            brep = (ON_Brep *)ON_BrepTrim::Edge(trim1);
            if (brep != (ON_Brep *)0x0) {
              (brep->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
              _vptr_ON_ClassArray = (_func_int **)0xffe5f8bd9e331dd2;
            }
            brep = (ON_Brep *)ON_BrepTrim::Edge(local_88);
            if (brep != (ON_Brep *)0x0) {
              (brep->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
              _vptr_ON_ClassArray = (_func_int **)0xffe5f8bd9e331dd2;
            }
            if (edge != (ON_BrepEdge *)0x0) {
              *(undefined1 *)
               &(edge->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
                _vptr_ON_Object = 1;
            }
          }
        }
      }
      finfo_local._4_4_ = (int)c2;
    }
  }
  return finfo_local._4_4_;
}

Assistant:

static 
int MakeCapLoopHelper(
          ON_ClassArray< ON_Extrusion_BrepForm_FaceInfo >& finfo,
          int fi0,
          int cap_index, // 0 = bottom, 1 = top
          ON_BrepFace* capface, 
          ON_BrepLoop::TYPE loop_type,
          bool* bTrimsWereModified
          )
{
  ON_BrepEdge* edge;

  if ( 0 == capface )
    return fi0; // happens when extrusion has an open end

  ON_Brep* brep = capface->Brep();
  if ( 0 == brep )
    return fi0;

  if ( fi0 < 0 || fi0 >= finfo.Count() )
    return fi0;

  ON_BrepLoop& loop = brep->NewLoop(loop_type,*capface);

  bool bRev3d = false;
  bool bCloseGaps = true;

  int fi1;
  for ( fi1 = fi0; fi1 < finfo.Count(); fi1++ )
  {
    if ( false == finfo[fi1].HaveBrepFaceFace() )
      continue; // profile segment for this face was too short or bogus

    if ( finfo[fi0].m_profile_index != finfo[fi1].m_profile_index )
      break;

    ON_NurbsCurve* c2 = finfo[fi1].m_cap_c2[cap_index];
    if ( 0 == c2 )
    {
      bCloseGaps = false;
      break;
    }
    int c2i = brep->AddTrimCurve(c2);
    finfo[fi1].m_cap_c2[cap_index] = 0;
    edge = brep->Edge(finfo[fi1].m_cap_edge_index[cap_index]);
    if ( 0 == edge )
    {
      bCloseGaps = false;
      break;
    }
    ON_BrepTrim& trim = brep->NewTrim(*edge, bRev3d, loop, c2i);
    trim.m_tolerance[0] = trim.m_tolerance[1] = 0.0;
  }
  brep->SetTrimIsoFlags( loop );

  // 6 June 2012 Dale Lear
  //    Fix bug 105311
  //    Sometimes there are gaps in ON_PolyCurve profiles that
  //    need to be closed to make a valid ON_Brep.  The gaps
  //    need to be closed after the call to SetTrimIsoFlags().
  if ( bCloseGaps ) for ( int lti = 0; lti < loop.m_ti.Count(); lti++ )
  {
    ON_BrepTrim& trim0 = brep->m_T[loop.m_ti[lti]];
    ON_BrepTrim& trim1 = brep->m_T[loop.m_ti[(lti+1)%loop.m_ti.Count()]];
    if ( trim0.PointAtEnd() != trim1.PointAtStart() )
    {
      if ( brep->CloseTrimGap(trim0,trim1) )
      {
        edge = trim0.Edge();
        if ( edge )
          edge->m_tolerance = ON_UNSET_VALUE;
        edge = trim1.Edge();
        if ( edge )
          edge->m_tolerance = ON_UNSET_VALUE;
        if ( 0 != bTrimsWereModified )
          *bTrimsWereModified = true;
      }
    }
  }

  return fi1;
}